

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

void If_ManSatTest2(void)

{
  int iVar1;
  Vec_Int_t *vLits_00;
  int RetValue;
  uint uSet;
  Vec_Int_t *vLits;
  word uFree;
  word uBound;
  word *pTruth;
  char *pDsd;
  sat_solver *p;
  int nLutSize;
  int nVars;
  
  p._4_4_ = 6;
  p._0_4_ = 4;
  pDsd = (char *)If_ManSatBuildXY(4);
  pTruth = (word *)anon_var_dwarf_1bf4fd;
  uBound = (word)Dau_DsdToTruth("0123456789ABCDEF{abcdef}",p._4_4_);
  vLits_00 = Vec_IntAlloc(100);
  iVar1 = If_ManSatCheckXY(pDsd,(int)p,(word *)uBound,p._4_4_,0x5d,&uFree,(word *)&vLits,vLits_00);
  if (iVar1 != 0) {
    Dau_DsdPrintFromTruth((word *)uBound,p._4_4_);
    Dau_DsdPrintFromTruth(&uFree,(int)p);
    Dau_DsdPrintFromTruth((word *)&vLits,(int)p);
    sat_solver_delete((sat_solver *)pDsd);
    Vec_IntFree(vLits_00);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSat.c"
                ,0x1fe,"void If_ManSatTest2()");
}

Assistant:

void If_ManSatTest2()
{
    int nVars = 6;
    int nLutSize = 4;
    sat_solver * p = (sat_solver *)If_ManSatBuildXY( nLutSize );
//    char * pDsd = "(abcdefg)";
//    char * pDsd = "([a!bc]d!e)";
    char * pDsd = "0123456789ABCDEF{abcdef}";
    word * pTruth = Dau_DsdToTruth( pDsd, nVars );
    word uBound, uFree;
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
//    unsigned uSet = (1 << 0) | (1 << 2) | (1 << 4) | (1 << 6);
//    unsigned uSet = (3 << 0) | (1 << 2) | (1 << 8) | (1 << 4);
    unsigned uSet = (1 << 0) | (3 << 2) | (1 << 4) | (1 << 6);
    int RetValue = If_ManSatCheckXY( p, nLutSize, pTruth, nVars, uSet, &uBound, &uFree, vLits );
    assert( RetValue );
    
//    Abc_TtPrintBinary( pTruth, nVars );
//    Abc_TtPrintBinary( &uBound, nLutSize );
//    Abc_TtPrintBinary( &uFree, nLutSize );

    Dau_DsdPrintFromTruth( pTruth, nVars );
    Dau_DsdPrintFromTruth( &uBound, nLutSize );
    Dau_DsdPrintFromTruth( &uFree, nLutSize );
    sat_solver_delete(p);
    Vec_IntFree( vLits );
}